

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format * __thiscall
format::string<std::__cxx11::string,char_const[9],char_const(&)[6],char_const(&)[6]>
          (format *this,char (*fmt) [9],char (*args) [6],char (*args_1) [6])

{
  char (*args_local_1) [6];
  char (*args_local) [6];
  char (*fmt_local) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  
  std::__cxx11::string::string((string *)this);
  append_string<std::__cxx11::string,char_const[9],char_const(&)[6],char_const(&)[6]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,fmt,args,
             args_1);
  return this;
}

Assistant:

StringType string(FormatType& fmt,
                    Args&& ... args) {
    StringType output;
    append_string(output, fmt, std::forward<Args>(args)...);
    return output;
  }